

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-builder.h
# Opt level: O0

Index __thiscall wasm::Builder::addParam(Builder *this,Function *func,Name name,Type type)

{
  pointer *this_00;
  Index IVar1;
  bool bVar2;
  size_type sVar3;
  size_t sVar4;
  size_type sVar5;
  mapped_type *pmVar6;
  mapped_type *this_01;
  Index local_bc;
  uintptr_t uStack_b8;
  Index index;
  Type local_b0;
  Signature local_a8;
  HeapType local_98 [3];
  allocator<wasm::Type> local_79;
  ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator> local_78;
  ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator> local_68;
  undefined1 local_58 [8];
  vector<wasm::Type,_std::allocator<wasm::Type>_> params;
  Signature sig;
  Function *func_local;
  Type type_local;
  Name name_local;
  
  func_local = name.super_IString.str._M_str;
  type_local.id = (uintptr_t)func;
  sVar3 = std::
          unordered_map<wasm::Name,_unsigned_int,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_unsigned_int>_>_>
          ::size((unordered_map<wasm::Name,_unsigned_int,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_unsigned_int>_>_>
                  *)(this + 0x14));
  sig.results = Function::getParams((Function *)this);
  sVar4 = wasm::Type::size(&sig.results);
  if (sVar3 != sVar4) {
    __assert_fail("func->localIndices.size() == func->getParams().size()",
                  "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/wasm-builder.h"
                  ,0x523,"static Index wasm::Builder::addParam(Function *, Name, Type)");
  }
  bVar2 = IString::is((IString *)&type_local);
  if (!bVar2) {
    __assert_fail("name.is()",
                  "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/wasm-builder.h"
                  ,0x524,"static Index wasm::Builder::addParam(Function *, Name, Type)");
  }
  join_0x00000010_0x00000000_ = Function::getSig((Function *)this);
  this_00 = &params.super__Vector_base<wasm::Type,_std::allocator<wasm::Type>_>._M_impl.
             super__Vector_impl_data._M_end_of_storage;
  local_68 = (ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>)
             wasm::Type::begin((Type *)this_00);
  local_78 = (ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>)
             wasm::Type::end((Type *)this_00);
  std::allocator<wasm::Type>::allocator(&local_79);
  std::vector<wasm::Type,std::allocator<wasm::Type>>::vector<wasm::Type::Iterator,void>
            ((vector<wasm::Type,std::allocator<wasm::Type>> *)local_58,(Iterator)local_68,
             (Iterator)local_78,&local_79);
  std::allocator<wasm::Type>::~allocator(&local_79);
  std::vector<wasm::Type,_std::allocator<wasm::Type>_>::push_back
            ((vector<wasm::Type,_std::allocator<wasm::Type>_> *)local_58,(value_type *)&func_local);
  wasm::Type::Type(&local_b0,(Tuple *)local_58);
  uStack_b8 = sig.params.id;
  Signature::Signature(&local_a8,local_b0,sig.params);
  HeapType::HeapType(local_98,local_a8);
  this[7].wasm = (Module *)local_98[0].id;
  sVar5 = std::
          unordered_map<unsigned_int,_wasm::Name,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_wasm::Name>_>_>
          ::size((unordered_map<unsigned_int,_wasm::Name,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_wasm::Name>_>_>
                  *)(this + 0xd));
  local_bc = (Index)sVar5;
  pmVar6 = std::
           unordered_map<wasm::Name,_unsigned_int,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_unsigned_int>_>_>
           ::operator[]((unordered_map<wasm::Name,_unsigned_int,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_unsigned_int>_>_>
                         *)(this + 0x14),(key_type *)&type_local);
  *pmVar6 = (Index)sVar5;
  this_01 = std::
            unordered_map<unsigned_int,_wasm::Name,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_wasm::Name>_>_>
            ::operator[]((unordered_map<unsigned_int,_wasm::Name,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_wasm::Name>_>_>
                          *)(this + 0xd),&local_bc);
  wasm::Name::operator=(this_01,(Name *)&type_local);
  IVar1 = local_bc;
  std::vector<wasm::Type,_std::allocator<wasm::Type>_>::~vector
            ((vector<wasm::Type,_std::allocator<wasm::Type>_> *)local_58);
  return IVar1;
}

Assistant:

static Index addParam(Function* func, Name name, Type type) {
    // only ok to add a param if no vars, otherwise indices are invalidated
    assert(func->localIndices.size() == func->getParams().size());
    assert(name.is());
    Signature sig = func->getSig();
    std::vector<Type> params(sig.params.begin(), sig.params.end());
    params.push_back(type);
    func->type = Signature(Type(params), sig.results);
    Index index = func->localNames.size();
    func->localIndices[name] = index;
    func->localNames[index] = name;
    return index;
  }